

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O2

Array __thiscall notch::pre::SquareAugmented::unapply(SquareAugmented *this,Array *input)

{
  ulong uVar1;
  uint in_EAX;
  ulong *in_RDX;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar2;
  void *__src;
  _func_int **__dest;
  ulong __n;
  Array AVar3;
  undefined8 uStack_28;
  
  uVar1 = *in_RDX;
  uStack_28 = (ulong)in_EAX;
  __n = uVar1 >> 1;
  core::std::valarray<float>::valarray((valarray<float> *)this,(float *)((long)&uStack_28 + 4),__n);
  pfVar2 = extraout_RDX;
  if (1 < uVar1) {
    __src = (void *)*in_RDX;
    if (__src != (void *)0x0) {
      __src = (void *)in_RDX[1];
    }
    __dest = (this->super_ADatasetTransformer)._vptr_ADatasetTransformer;
    if (__dest != (_func_int **)0x0) {
      __dest = this[1].super_ADatasetTransformer._vptr_ADatasetTransformer;
    }
    memmove(__dest,__src,__n << 2);
    pfVar2 = extraout_RDX_00;
  }
  AVar3._M_data = pfVar2;
  AVar3._M_size = (size_t)this;
  return AVar3;
}

Assistant:

virtual Array unapply(const Array &input) {
        size_t n = input.size();
        Array output(0.0, n / 2);
        std::copy(std::begin(input),
                  std::begin(input) + (n/2),
                  std::begin(output));
        return output;
    }